

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_int8.h
# Opt level: O1

void ncnn::conv_im2col_sgemm_int8_requant_sse
               (Mat *bottom_blob,Mat *top_blob,Mat *_kernel,int kernel_w,int kernel_h,int stride_w,
               int stride_h,Mat *_bias,vector<float,_std::allocator<float>_> *scale_requant,
               Option *opt)

{
  char cVar1;
  float fVar2;
  size_t sVar3;
  size_t sVar4;
  pointer pfVar5;
  undefined1 auVar6 [14];
  undefined1 auVar7 [14];
  undefined1 auVar8 [14];
  undefined1 auVar9 [14];
  undefined1 auVar10 [14];
  undefined1 auVar11 [14];
  undefined1 auVar12 [14];
  undefined1 auVar13 [14];
  int *piVar14;
  undefined1 auVar15 [14];
  undefined1 auVar16 [14];
  undefined1 auVar17 [14];
  undefined1 auVar18 [14];
  float fVar19;
  undefined1 uVar20;
  uint _w;
  uint uVar21;
  ulong *puVar22;
  uint uVar23;
  uint uVar24;
  long lVar25;
  long lVar26;
  char *pcVar27;
  char *pcVar28;
  int iVar29;
  uint _h;
  int iVar30;
  int iVar31;
  ulong uVar32;
  undefined1 *puVar33;
  long lVar34;
  int iVar35;
  undefined1 *puVar36;
  int iVar37;
  int iVar38;
  int iVar39;
  uint uVar40;
  long lVar41;
  long lVar42;
  long lVar43;
  undefined1 *puVar44;
  undefined1 *puVar45;
  void *pvVar46;
  undefined4 *puVar47;
  long lVar48;
  long lVar49;
  long lVar50;
  int n_1;
  ulong uVar51;
  undefined1 *puVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar58;
  float fVar59;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  float fVar60;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [12];
  undefined1 auVar66 [12];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar67 [12];
  undefined1 auVar73 [16];
  undefined1 auVar68 [12];
  undefined1 auVar76 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [12];
  short sVar92;
  short sVar93;
  short sVar94;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar88 [16];
  short sVar95;
  short sVar97;
  undefined1 auVar96 [16];
  short sVar98;
  short sVar101;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  short sVar105;
  short sVar106;
  short sVar107;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  short sVar108;
  short sVar110;
  undefined1 auVar109 [16];
  undefined1 auVar111 [16];
  short sVar112;
  short sVar114;
  undefined1 auVar113 [16];
  float fVar115;
  float fVar116;
  int sum0 [4];
  Mat bottom_tm;
  int sum3 [4];
  int sum2 [4];
  int sum1 [4];
  Mat kernel_tm;
  Mat bottom_im2row;
  undefined1 local_1d8 [16];
  ulong local_1c0;
  undefined8 local_1b8;
  ulong local_1b0;
  undefined8 local_1a8;
  float fStack_1a0;
  float fStack_19c;
  undefined8 local_198;
  float fStack_190;
  float fStack_18c;
  void *local_188;
  undefined1 *local_180;
  ulong local_178;
  Mat *local_170;
  ulong local_168;
  undefined1 *local_160;
  undefined1 local_158 [64];
  size_t local_118;
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [64];
  size_t local_98;
  undefined1 *local_88;
  undefined1 *local_80;
  undefined1 local_78 [64];
  size_t local_38;
  undefined1 auVar71 [16];
  undefined1 auVar74 [16];
  undefined1 auVar77 [16];
  undefined1 auVar72 [16];
  undefined1 auVar75 [16];
  undefined1 auVar78 [16];
  undefined1 auVar85 [16];
  undefined1 auVar89 [16];
  undefined1 auVar86 [16];
  undefined1 auVar90 [16];
  undefined1 auVar87 [16];
  undefined1 auVar91 [16];
  
  uVar23 = bottom_blob->w;
  uVar21 = bottom_blob->c;
  iVar38 = top_blob->w;
  iVar35 = top_blob->h;
  local_198 = _kernel->data;
  local_188 = _bias->data;
  iVar29 = kernel_h * kernel_w;
  _w = uVar21 * iVar29;
  _h = iVar35 * iVar38;
  local_1c0 = (ulong)top_blob->c;
  local_38 = 0;
  local_78._0_8_ = (void *)0x0;
  local_78._8_4_ = 0;
  local_78._12_4_ = 0;
  local_78._16_8_ = 0;
  local_78._24_4_ = 0;
  local_78._32_8_ = (Allocator *)0x0;
  local_78._40_4_ = 0;
  local_78._44_4_ = 0;
  local_78._48_12_ = SUB1612((undefined1  [16])0x0,4);
  local_170 = top_blob;
  Mat::create((Mat *)local_78,_w,_h,1,opt->workspace_allocator);
  if (0 < iVar35) {
    local_1a8 = (ulong)(stride_h * uVar23);
    lVar49 = 0;
    iVar37 = 0;
    iVar31 = 0;
    do {
      if (0 < iVar38) {
        iVar30 = 0;
        lVar48 = lVar49;
        do {
          if (0 < (int)uVar21) {
            uVar32 = 0;
            do {
              if (0 < kernel_h) {
                sVar3 = bottom_blob->cstep;
                sVar4 = bottom_blob->elemsize;
                pvVar46 = bottom_blob->data;
                iVar39 = 0;
                lVar42 = lVar48;
                do {
                  if (0 < kernel_w) {
                    uVar51 = 0;
                    do {
                      *(undefined1 *)(local_78._0_8_ + uVar51 + (long)iVar37) =
                           *(undefined1 *)
                            ((long)pvVar46 +
                            (long)((int)lVar42 + (int)uVar51) + sVar3 * uVar32 * sVar4);
                      uVar51 = uVar51 + 1;
                    } while ((uint)kernel_w != uVar51);
                    iVar37 = iVar37 + (int)uVar51;
                  }
                  iVar39 = iVar39 + 1;
                  lVar42 = lVar42 + (ulong)uVar23;
                } while (iVar39 != kernel_h);
              }
              uVar32 = uVar32 + 1;
            } while (uVar32 != uVar21);
          }
          iVar30 = iVar30 + 1;
          lVar48 = lVar48 + (ulong)(uint)stride_w;
        } while (iVar30 != iVar38);
      }
      iVar31 = iVar31 + 1;
      lVar49 = lVar49 + local_1a8;
    } while (iVar31 != iVar35);
  }
  uVar23 = _h + 3;
  if (-1 < (int)_h) {
    uVar23 = _h;
  }
  local_118 = 0;
  local_158._0_8_ = (void *)0x0;
  local_158._8_4_ = 0;
  local_158._12_4_ = 0;
  local_158._16_8_ = 0;
  local_158._24_4_ = 0;
  local_158._32_8_ = (Allocator *)0x0;
  local_158._40_4_ = 0;
  local_158._44_4_ = 0;
  local_158._48_12_ = SUB1612((undefined1  [16])0x0,4);
  Mat::create((Mat *)local_158,iVar29 * 4,uVar21,_h + ((int)uVar23 >> 2) * -3,1,
              opt->workspace_allocator);
  local_178 = local_1c0;
  local_1b8 = CONCAT44(local_1b8._4_4_,_h) & 0xfffffffffffffffc;
  if (0 < (int)_h >> 2) {
    local_1b0 = (ulong)(uint)((int)_h >> 2);
    lVar41 = 1;
    lVar42 = 2;
    lVar49 = 3;
    lVar48 = 0;
    uVar32 = 0;
    do {
      lVar25 = (long)(int)local_78._44_4_;
      puVar33 = (undefined1 *)(local_118 * uVar32 * local_158._16_8_ + local_158._0_8_);
      if ((int)_w < 2) {
        lVar25 = local_78._16_8_ * lVar25;
        lVar43 = uVar32 * 4 * lVar25;
        lVar50 = (uVar32 * 4 + 1) * lVar25;
        lVar34 = (uVar32 * 4 + 2) * lVar25;
        lVar25 = (uVar32 * 4 + 3) * lVar25;
        uVar23 = 0;
      }
      else {
        lVar43 = local_78._16_8_ * lVar48 * lVar25;
        lVar50 = local_78._16_8_ * lVar41 * lVar25;
        lVar34 = local_78._16_8_ * lVar42 * lVar25;
        local_1a8 = local_78._16_8_ * lVar49 * lVar25;
        lVar26 = 0;
        do {
          puVar36 = puVar33;
          puVar33 = (undefined1 *)
                    (local_158._0_8_ + lVar26 * 4 + local_118 * local_158._16_8_ * uVar32);
          *puVar33 = *(undefined1 *)(local_78._0_8_ + lVar26 + lVar43);
          puVar33[1] = *(undefined1 *)(local_78._0_8_ + lVar26 + lVar43 + 1);
          puVar33[2] = *(undefined1 *)(local_78._0_8_ + lVar26 + lVar50);
          puVar33[3] = *(undefined1 *)(local_78._0_8_ + lVar26 + lVar50 + 1);
          puVar33[4] = *(undefined1 *)(local_78._0_8_ + lVar26 + lVar34);
          puVar33[5] = *(undefined1 *)(local_78._0_8_ + lVar26 + lVar34 + 1);
          puVar33[6] = *(undefined1 *)(local_78._0_8_ + lVar26 + local_1a8);
          puVar33[7] = *(undefined1 *)(local_78._0_8_ + lVar26 + local_1a8 + 1);
          lVar25 = lVar26 + 2;
          iVar38 = (int)lVar26;
          lVar26 = lVar25;
          puVar33 = puVar33 + 8;
        } while (iVar38 + 3 < (int)_w);
        puVar33 = puVar36 + 8;
        lVar43 = lVar43 + lVar25;
        lVar50 = lVar50 + lVar25;
        lVar34 = lVar34 + lVar25;
        lVar25 = local_1a8 + lVar25;
        uVar23 = _w & 0xfffffffe;
      }
      if ((int)uVar23 < (int)_w) {
        lVar26 = 0;
        do {
          puVar33[lVar26 * 4] = *(undefined1 *)(local_78._0_8_ + lVar26 + lVar43);
          puVar33[lVar26 * 4 + 1] = *(undefined1 *)(local_78._0_8_ + lVar26 + lVar50);
          puVar33[lVar26 * 4 + 2] = *(undefined1 *)(local_78._0_8_ + lVar26 + lVar34);
          puVar33[lVar26 * 4 + 3] = *(undefined1 *)(local_78._0_8_ + lVar26 + lVar25);
          lVar26 = lVar26 + 1;
        } while (_w - uVar23 != (int)lVar26);
      }
      uVar32 = uVar32 + 1;
      lVar48 = lVar48 + 4;
      lVar41 = lVar41 + 4;
      lVar42 = lVar42 + 4;
      lVar49 = lVar49 + 4;
    } while (uVar32 != local_1b0);
  }
  if ((_h & 0xfffffffc) != _h) {
    lVar49 = (long)(int)(_h & 0xfffffffc);
    do {
      puVar33 = (undefined1 *)((int)local_78._44_4_ * lVar49 * local_78._16_8_ + local_78._0_8_);
      uVar23 = (uint)lVar49;
      uVar40 = uVar23 + 3;
      if (-1 < (int)uVar23) {
        uVar40 = uVar23;
      }
      puVar36 = (undefined1 *)
                ((long)(int)(((int)uVar40 >> 2) + (uVar23 - (uVar40 & 0xfffffffc))) * local_118 *
                 local_158._16_8_ + local_158._0_8_);
      if ((int)_w < 2) {
        uVar23 = 0;
      }
      else {
        iVar38 = 1;
        do {
          *puVar36 = *puVar33;
          puVar36[1] = puVar33[1];
          puVar36 = puVar36 + 2;
          puVar33 = puVar33 + 2;
          iVar38 = iVar38 + 2;
          uVar23 = _w & 0xfffffffe;
        } while (iVar38 < (int)_w);
      }
      if ((int)uVar23 < (int)_w) {
        lVar48 = 0;
        do {
          puVar36[lVar48] = puVar33[lVar48];
          lVar48 = lVar48 + 1;
        } while (_w - uVar23 != (int)lVar48);
      }
      lVar49 = lVar49 + 1;
    } while (lVar49 < (int)_h);
  }
  uVar23 = (uint)local_1c0;
  uVar40 = uVar23 + 3;
  if (-1 < (int)uVar23) {
    uVar40 = uVar23;
  }
  uVar24 = uVar23 + 3;
  if (-1 < (int)uVar23) {
    uVar24 = uVar23;
  }
  local_98 = 0;
  local_d8._0_8_ = (void *)0x0;
  local_d8._8_4_ = 0;
  local_d8._12_4_ = 0;
  local_d8._16_8_ = 0;
  local_d8._24_4_ = 0;
  local_d8._32_8_ = (Allocator *)0x0;
  local_d8._40_4_ = 0;
  local_d8._44_4_ = 0;
  local_d8._48_12_ = SUB1612((undefined1  [16])0x0,4);
  Mat::create((Mat *)local_d8,iVar29 * 4,uVar21,
              (uVar23 - (uVar24 & 0xfffffffc)) + ((int)uVar40 >> 2),1,opt->workspace_allocator);
  uVar23 = (int)uVar23 >> 2;
  local_178 = local_178 & 0xfffffffffffffffc;
  local_168 = (ulong)uVar23;
  if (0 < (int)uVar23) {
    iVar37 = uVar21 * iVar29;
    iVar31 = kernel_h * uVar21 * kernel_w;
    iVar35 = iVar31 * 3;
    iVar38 = iVar31 * 4;
    iVar31 = iVar31 * 2;
    iVar30 = 0;
    uVar32 = 0;
    uVar40 = _w;
    do {
      puVar33 = (undefined1 *)(local_98 * uVar32 * local_d8._16_8_ + local_d8._0_8_);
      if ((int)_w < 2) {
        iVar39 = (int)uVar32;
        lVar49 = (long)((iVar39 * 4 + 3) * iVar37);
        lVar48 = (long)((iVar39 * 4 + 2) * iVar37);
        lVar42 = (long)((iVar39 * 4 + 1) * iVar37);
        lVar41 = (long)(iVar39 * 4 * iVar37);
        uVar24 = 0;
      }
      else {
        lVar49 = 0;
        do {
          puVar36 = puVar33;
          puVar33 = (undefined1 *)
                    (local_d8._0_8_ + lVar49 * 4 + local_98 * local_d8._16_8_ * uVar32);
          *puVar33 = *(undefined1 *)((long)local_198 + lVar49 + iVar30);
          puVar33[1] = *(undefined1 *)((long)local_198 + lVar49 + (long)iVar30 + 1);
          puVar33[2] = *(undefined1 *)((long)local_198 + lVar49 + (int)uVar40);
          puVar33[3] = *(undefined1 *)((long)local_198 + lVar49 + (long)(int)uVar40 + 1);
          puVar33[4] = *(undefined1 *)((long)local_198 + lVar49 + iVar31);
          puVar33[5] = *(undefined1 *)((long)local_198 + lVar49 + (long)iVar31 + 1);
          puVar33[6] = *(undefined1 *)((long)local_198 + lVar49 + iVar35);
          puVar33[7] = *(undefined1 *)((long)local_198 + lVar49 + (long)iVar35 + 1);
          lVar41 = lVar49 + 2;
          iVar39 = (int)lVar49;
          lVar49 = lVar41;
          puVar33 = puVar33 + 8;
        } while (iVar39 + 3 < (int)_w);
        puVar33 = puVar36 + 8;
        lVar49 = lVar41 + iVar35;
        lVar48 = lVar41 + iVar31;
        lVar42 = lVar41 + (int)uVar40;
        lVar41 = lVar41 + iVar30;
        uVar24 = _w & 0xfffffffe;
      }
      if ((int)uVar24 < (int)_w) {
        lVar25 = 0;
        do {
          puVar33[lVar25 * 4] = *(undefined1 *)((long)local_198 + lVar25 + lVar41);
          puVar33[lVar25 * 4 + 1] = *(undefined1 *)((long)local_198 + lVar25 + lVar42);
          puVar33[lVar25 * 4 + 2] = *(undefined1 *)((long)local_198 + lVar25 + lVar48);
          puVar33[lVar25 * 4 + 3] = *(undefined1 *)((long)local_198 + lVar25 + lVar49);
          lVar25 = lVar25 + 1;
        } while (_w - uVar24 != (int)lVar25);
      }
      uVar32 = uVar32 + 1;
      iVar35 = iVar35 + iVar38;
      iVar31 = iVar31 + iVar38;
      uVar40 = uVar40 + iVar38;
      iVar30 = iVar30 + iVar38;
    } while (uVar32 != local_168);
  }
  if ((int)local_178 != (int)local_1c0) {
    uVar32 = local_178;
    do {
      uVar40 = (uint)uVar32;
      uVar24 = uVar40 + 3;
      if (-1 < (int)uVar40) {
        uVar24 = uVar40;
      }
      puVar36 = (undefined1 *)
                ((long)(int)(((int)uVar24 >> 2) + (uVar40 - (uVar24 & 0xfffffffc))) * local_98 *
                 local_d8._16_8_ + local_d8._0_8_);
      puVar33 = (undefined1 *)((long)(int)(uVar21 * iVar29 * uVar40) + (long)local_198);
      if ((int)_w < 2) {
        uVar40 = 0;
      }
      else {
        iVar38 = 1;
        do {
          *puVar36 = *puVar33;
          puVar36[1] = puVar33[1];
          puVar36 = puVar36 + 2;
          puVar33 = puVar33 + 2;
          iVar38 = iVar38 + 2;
          uVar40 = _w & 0xfffffffe;
        } while (iVar38 < (int)_w);
      }
      if ((int)uVar40 < (int)_w) {
        lVar49 = 0;
        do {
          puVar36[lVar49] = puVar33[lVar49];
          lVar49 = lVar49 + 1;
        } while (_w - uVar40 != (int)lVar49);
      }
      uVar32 = uVar32 + 1;
    } while ((long)uVar32 < (long)local_1c0);
  }
  local_160 = (undefined1 *)(ulong)_h;
  if (0 < (int)uVar23) {
    uVar32 = 0;
    do {
      fVar115 = 0.0;
      fVar116 = 0.0;
      if (local_188 != (void *)0x0) {
        fVar116 = *(float *)((long)local_188 + uVar32 * 0x10);
      }
      lVar49 = uVar32 * 4 + 1;
      if (local_188 != (void *)0x0) {
        fVar115 = *(float *)((long)local_188 + lVar49 * 4);
      }
      lVar48 = uVar32 * 4 + 2;
      fVar54 = 0.0;
      fVar60 = 0.0;
      if (local_188 != (void *)0x0) {
        fVar60 = *(float *)((long)local_188 + lVar48 * 4);
      }
      lVar42 = uVar32 * 4 + 3;
      if (local_188 != (void *)0x0) {
        fVar54 = *(float *)((long)local_188 + lVar42 * 4);
      }
      sVar3 = local_170->cstep;
      pvVar46 = local_170->data;
      sVar4 = local_170->elemsize;
      puVar36 = (undefined1 *)(uVar32 * 4 * sVar3 * sVar4 + (long)pvVar46);
      puVar52 = (undefined1 *)(sVar3 * lVar49 * sVar4 + (long)pvVar46);
      puVar45 = (undefined1 *)(sVar3 * lVar48 * sVar4 + (long)pvVar46);
      puVar44 = (undefined1 *)(sVar3 * lVar42 * sVar4 + (long)pvVar46);
      puVar33 = (undefined1 *)0x0;
      pfVar5 = (scale_requant->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start;
      local_198 = (void *)CONCAT44(local_198._4_4_,pfVar5[uVar32 * 8]);
      fVar55 = pfVar5[uVar32 * 8 + 1];
      fVar59 = pfVar5[lVar49 * 2];
      fVar58 = pfVar5[lVar48 * 2];
      fVar2 = pfVar5[lVar42 * 2];
      fVar19 = pfVar5[lVar42 * 2 + 1];
      local_1a8 = CONCAT44(local_1a8._4_4_,pfVar5[lVar49 * 2 + 1]);
      local_1b0 = CONCAT44(local_1b0._4_4_,pfVar5[lVar48 * 2 + 1]);
      local_1b8 = uVar32;
      if (3 < (int)_h) {
        puVar33 = (undefined1 *)0x0;
        do {
          puVar22 = (ulong *)(((ulong)puVar33 >> 2) * local_118 * local_158._16_8_ + local_158._0_8_
                             );
          pcVar27 = (char *)(local_98 * local_1b8 * local_d8._16_8_ + local_d8._0_8_);
          local_1d8 = (undefined1  [16])0x0;
          local_e8 = (undefined1  [16])0x0;
          local_f8 = (undefined1  [16])0x0;
          local_108 = (undefined1  [16])0x0;
          uVar23 = 0;
          if (1 < (int)_w) {
            local_1d8 = (undefined1  [16])0x0;
            local_e8._0_4_ = 0;
            local_e8._4_4_ = 0;
            local_e8._8_4_ = 0;
            local_e8._12_4_ = 0;
            local_f8._0_4_ = 0;
            local_f8._4_4_ = 0;
            local_f8._8_4_ = 0;
            local_f8._12_4_ = 0;
            iVar38 = 1;
            local_108._0_4_ = 0;
            local_108._4_4_ = 0;
            local_108._8_4_ = 0;
            local_108._12_4_ = 0;
            do {
              cVar1 = pcVar27[1];
              iVar35 = (int)cVar1;
              iVar29 = (int)*pcVar27;
              auVar99._4_4_ = iVar29;
              auVar99._0_4_ = iVar29;
              auVar99._8_4_ = iVar29;
              auVar99._12_4_ = iVar29;
              auVar65._0_8_ = CONCAT44(iVar35,iVar35);
              auVar65._8_4_ = iVar35;
              auVar83._12_4_ = iVar35;
              auVar83._0_12_ = auVar65;
              auVar81._8_8_ = 0;
              auVar81._0_8_ = *puVar22;
              auVar102 = psllw(auVar81,8);
              auVar102 = psraw(auVar102,8);
              auVar96 = pshuflw(ZEXT416((uint)(int)pcVar27[2]),ZEXT416((uint)(int)pcVar27[2]),0);
              auVar103._0_2_ = auVar102._0_2_;
              sVar95 = auVar96._0_2_ * auVar103._0_2_;
              sVar105 = auVar102._2_2_;
              sVar97 = auVar96._2_2_ * sVar105;
              sVar106 = auVar102._4_2_;
              sVar107 = auVar102._6_2_;
              auVar109 = pshuflw(ZEXT416((uint)(int)pcVar27[4]),ZEXT416((uint)(int)pcVar27[4]),0);
              sVar108 = auVar109._0_2_ * auVar103._0_2_;
              sVar110 = auVar109._2_2_ * sVar105;
              auVar111 = pshuflw(ZEXT416((uint)(int)pcVar27[6]),ZEXT416((uint)(int)pcVar27[6]),0);
              auVar8._10_2_ = 0;
              auVar8._0_10_ = auVar102._0_10_;
              auVar8._12_2_ = sVar107;
              auVar12._8_2_ = sVar106;
              auVar12._0_8_ = auVar102._0_8_;
              auVar12._10_4_ = auVar8._10_4_;
              auVar15._6_8_ = 0;
              auVar15._0_6_ = auVar12._8_6_;
              auVar103._6_8_ = SUB148(auVar15 << 0x40,6);
              auVar103._4_2_ = sVar105;
              auVar103._2_2_ = 0;
              auVar103._14_2_ = 0;
              auVar104 = pmaddwd(auVar103,auVar99);
              auVar102 = psraw(auVar81,8);
              auVar100 = pshuflw(ZEXT416((uint)(int)pcVar27[3]),ZEXT416((uint)(int)pcVar27[3]),0);
              auVar82._0_2_ = auVar102._0_2_;
              sVar98 = auVar100._0_2_ * auVar82._0_2_;
              sVar92 = auVar102._2_2_;
              sVar101 = auVar100._2_2_ * sVar92;
              sVar93 = auVar102._4_2_;
              sVar94 = auVar102._6_2_;
              auVar113 = pshuflw(ZEXT416((uint)(int)pcVar27[5]),ZEXT416((uint)(int)pcVar27[5]),0);
              sVar112 = auVar113._0_2_ * auVar82._0_2_;
              sVar114 = auVar113._2_2_ * sVar92;
              auVar81 = pshuflw(ZEXT416((uint)(int)pcVar27[7]),ZEXT416((uint)(int)pcVar27[7]),0);
              auVar6._10_2_ = 0;
              auVar6._0_10_ = auVar102._0_10_;
              auVar6._12_2_ = sVar94;
              auVar9._8_2_ = sVar93;
              auVar9._0_8_ = auVar102._0_8_;
              auVar9._10_4_ = auVar6._10_4_;
              auVar16._6_8_ = 0;
              auVar16._0_6_ = auVar9._8_6_;
              auVar82._6_8_ = SUB148(auVar16 << 0x40,6);
              auVar82._4_2_ = sVar92;
              auVar82._2_2_ = 0;
              auVar82._14_2_ = 0;
              auVar83 = pmaddwd(auVar82,auVar83);
              auVar84._0_4_ = auVar83._0_4_;
              iVar29 = local_1d8._4_4_;
              iVar31 = local_1d8._8_4_;
              iVar37 = local_1d8._12_4_;
              local_1d8._0_4_ = local_1d8._0_4_ + auVar84._0_4_ + auVar104._0_4_;
              local_1d8._4_4_ = iVar29 + auVar83._4_4_ + auVar104._4_4_;
              local_1d8._8_4_ = iVar31 + auVar83._8_4_ + auVar104._8_4_;
              local_1d8._12_4_ = iVar37 + auVar83._12_4_ + auVar104._12_4_;
              auVar69._12_2_ = (undefined2)(cVar1 >> 7);
              auVar69._0_12_ = auVar65;
              auVar69._14_2_ = auVar100._6_2_ * sVar94;
              auVar104._12_4_ = auVar69._12_4_;
              auVar104._0_10_ = auVar65._0_10_;
              auVar104._10_2_ = auVar100._4_2_ * sVar93;
              auVar100._10_6_ = auVar104._10_6_;
              auVar100._8_2_ = (short)cVar1;
              auVar100._0_8_ = auVar65._0_8_;
              auVar102._8_8_ = auVar100._8_8_;
              auVar102._6_2_ = sVar101;
              auVar102._4_2_ = (undefined2)(cVar1 >> 7);
              auVar102._0_4_ = iVar35;
              auVar70._0_4_ = (int)sVar98;
              iVar35 = auVar102._4_4_ >> 0x10;
              auVar66._0_8_ = CONCAT44(iVar35,auVar70._0_4_);
              auVar66._8_4_ = auVar100._8_4_ >> 0x10;
              auVar72._12_2_ = sVar101 >> 0xf;
              auVar72._0_12_ = auVar66;
              auVar72._14_2_ = auVar96._6_2_ * sVar107;
              auVar71._12_4_ = auVar72._12_4_;
              auVar71._0_10_ = auVar66._0_10_;
              auVar71._10_2_ = auVar96._4_2_ * sVar106;
              auVar96._10_6_ = auVar71._10_6_;
              auVar96._8_2_ = sVar101;
              auVar96._0_8_ = auVar66._0_8_;
              auVar70._8_8_ = auVar96._8_8_;
              auVar70._6_2_ = sVar97;
              auVar70._4_2_ = sVar98 >> 0xf;
              auVar73._0_4_ = (int)sVar95;
              iVar29 = auVar70._4_4_ >> 0x10;
              auVar67._0_8_ = CONCAT44(iVar29,auVar73._0_4_);
              auVar67._8_4_ = auVar96._8_4_ >> 0x10;
              local_e8._0_4_ = local_e8._0_4_ + auVar70._0_4_ + auVar73._0_4_;
              local_e8._4_4_ = local_e8._4_4_ + iVar35 + iVar29;
              local_e8._8_4_ = local_e8._8_4_ + auVar66._8_4_ + auVar67._8_4_;
              local_e8._12_4_ =
                   local_e8._12_4_ + (auVar104._12_4_ >> 0x10) + (auVar71._12_4_ >> 0x10);
              auVar75._12_2_ = sVar97 >> 0xf;
              auVar75._0_12_ = auVar67;
              auVar75._14_2_ = auVar109._6_2_ * sVar107;
              auVar74._12_4_ = auVar75._12_4_;
              auVar74._0_10_ = auVar67._0_10_;
              auVar74._10_2_ = auVar109._4_2_ * sVar106;
              auVar109._10_6_ = auVar74._10_6_;
              auVar109._8_2_ = sVar97;
              auVar109._0_8_ = auVar67._0_8_;
              auVar73._8_8_ = auVar109._8_8_;
              auVar73._6_2_ = sVar110;
              auVar73._4_2_ = sVar95 >> 0xf;
              auVar76._0_4_ = (int)sVar108;
              iVar35 = auVar73._4_4_ >> 0x10;
              auVar68._0_8_ = CONCAT44(iVar35,auVar76._0_4_);
              auVar68._8_4_ = auVar109._8_4_ >> 0x10;
              auVar87._0_12_ = auVar83._0_12_;
              auVar87._12_2_ = auVar83._6_2_;
              auVar87._14_2_ = auVar113._6_2_ * sVar94;
              auVar86._12_4_ = auVar87._12_4_;
              auVar86._0_10_ = auVar83._0_10_;
              auVar86._10_2_ = auVar113._4_2_ * sVar93;
              auVar85._10_6_ = auVar86._10_6_;
              auVar85._0_8_ = auVar83._0_8_;
              auVar85._8_2_ = auVar83._4_2_;
              auVar84._8_8_ = auVar85._8_8_;
              auVar84._6_2_ = sVar114;
              auVar84._4_2_ = auVar83._2_2_;
              auVar88._0_4_ = (int)sVar112;
              iVar29 = auVar84._4_4_ >> 0x10;
              auVar80._0_8_ = CONCAT44(iVar29,auVar88._0_4_);
              auVar80._8_4_ = auVar85._8_4_ >> 0x10;
              local_f8._0_4_ = local_f8._0_4_ + auVar88._0_4_ + auVar76._0_4_;
              local_f8._4_4_ = local_f8._4_4_ + iVar29 + iVar35;
              local_f8._8_4_ = local_f8._8_4_ + auVar80._8_4_ + auVar68._8_4_;
              local_f8._12_4_ =
                   local_f8._12_4_ + (auVar86._12_4_ >> 0x10) + (auVar74._12_4_ >> 0x10);
              auVar78._12_2_ = sVar110 >> 0xf;
              auVar78._0_12_ = auVar68;
              auVar78._14_2_ = auVar111._6_2_ * sVar107;
              auVar77._12_4_ = auVar78._12_4_;
              auVar77._0_10_ = auVar68._0_10_;
              auVar77._10_2_ = auVar111._4_2_ * sVar106;
              auVar113._10_6_ = auVar77._10_6_;
              auVar113._8_2_ = sVar110;
              auVar113._0_8_ = auVar68._0_8_;
              auVar76._8_8_ = auVar113._8_8_;
              auVar76._6_2_ = auVar111._2_2_ * sVar105;
              auVar76._4_2_ = sVar108 >> 0xf;
              auVar91._12_2_ = sVar114 >> 0xf;
              auVar91._0_12_ = auVar80;
              auVar91._14_2_ = auVar81._6_2_ * sVar94;
              auVar90._12_4_ = auVar91._12_4_;
              auVar90._0_10_ = auVar80._0_10_;
              auVar90._10_2_ = auVar81._4_2_ * sVar93;
              auVar89._10_6_ = auVar90._10_6_;
              auVar89._8_2_ = sVar114;
              auVar89._0_8_ = auVar80._0_8_;
              auVar88._8_8_ = auVar89._8_8_;
              auVar88._6_2_ = auVar81._2_2_ * sVar92;
              auVar88._4_2_ = sVar112 >> 0xf;
              local_108._0_4_ =
                   local_108._0_4_ + (int)(short)(auVar81._0_2_ * auVar82._0_2_) +
                   (int)(short)(auVar111._0_2_ * auVar103._0_2_);
              local_108._4_4_ = local_108._4_4_ + (auVar88._4_4_ >> 0x10) + (auVar76._4_4_ >> 0x10);
              local_108._8_4_ = local_108._8_4_ + (auVar89._8_4_ >> 0x10) + (auVar113._8_4_ >> 0x10)
              ;
              local_108._12_4_ =
                   local_108._12_4_ + (auVar90._12_4_ >> 0x10) + (auVar77._12_4_ >> 0x10);
              pcVar27 = pcVar27 + 8;
              puVar22 = puVar22 + 1;
              iVar38 = iVar38 + 2;
            } while (iVar38 < (int)_w);
            uVar23 = _w & 0xfffffffe;
          }
          if ((int)uVar23 < (int)_w) {
            do {
              lVar49 = 0;
              do {
                iVar38 = (int)*(char *)((long)puVar22 + lVar49);
                *(int *)(local_1d8 + lVar49 * 4) =
                     *(int *)(local_1d8 + lVar49 * 4) + *pcVar27 * iVar38;
                *(int *)(local_e8 + lVar49 * 4) =
                     *(int *)(local_e8 + lVar49 * 4) + pcVar27[1] * iVar38;
                *(int *)(local_f8 + lVar49 * 4) =
                     *(int *)(local_f8 + lVar49 * 4) + pcVar27[2] * iVar38;
                *(int *)(local_108 + lVar49 * 4) =
                     *(int *)(local_108 + lVar49 * 4) + pcVar27[3] * iVar38;
                lVar49 = lVar49 + 1;
              } while (lVar49 != 4);
              pcVar27 = pcVar27 + 4;
              puVar22 = (ulong *)((long)puVar22 + 4);
              uVar23 = uVar23 + 1;
            } while (uVar23 != _w);
          }
          lVar49 = 0;
          local_180 = puVar33;
          do {
            fVar53 = roundf(((float)*(int *)(local_1d8 + lVar49 * 4) * (float)local_198 + fVar116) *
                            fVar55);
            iVar38 = (int)fVar53;
            if (iVar38 < -0x7e) {
              iVar38 = -0x7f;
            }
            uVar20 = (undefined1)iVar38;
            if (0x7e < iVar38) {
              uVar20 = 0x7f;
            }
            puVar36[lVar49] = uVar20;
            fVar53 = roundf(((float)*(int *)(local_e8 + lVar49 * 4) * fVar59 + fVar115) *
                            (float)local_1a8);
            iVar38 = (int)fVar53;
            if (iVar38 < -0x7e) {
              iVar38 = -0x7f;
            }
            if (0x7e < iVar38) {
              iVar38 = 0x7f;
            }
            puVar52[lVar49] = (char)iVar38;
            fVar53 = roundf(((float)*(int *)(local_f8 + lVar49 * 4) * fVar58 + fVar60) *
                            (float)local_1b0);
            iVar38 = (int)fVar53;
            if (iVar38 < -0x7e) {
              iVar38 = -0x7f;
            }
            uVar20 = (undefined1)iVar38;
            if (0x7e < iVar38) {
              uVar20 = 0x7f;
            }
            puVar45[lVar49] = uVar20;
            fVar53 = roundf(((float)*(int *)(local_108 + lVar49 * 4) * fVar2 + fVar54) * fVar19);
            iVar38 = (int)fVar53;
            if (iVar38 < -0x7e) {
              iVar38 = -0x7f;
            }
            uVar20 = (undefined1)iVar38;
            if (0x7e < iVar38) {
              uVar20 = 0x7f;
            }
            puVar44[lVar49] = uVar20;
            lVar49 = lVar49 + 1;
          } while (lVar49 != 4);
          puVar36 = puVar36 + 4;
          puVar52 = puVar52 + 4;
          puVar45 = puVar45 + 4;
          puVar44 = puVar44 + 4;
          puVar33 = local_180 + 4;
        } while (local_180 + 7 < local_160);
      }
      if ((int)puVar33 < (int)_h) {
        do {
          pcVar27 = (char *)((((uint)puVar33 & 3) + ((uint)((ulong)puVar33 >> 2) & 0x3fffffff)) *
                             local_118 * local_158._16_8_ + local_158._0_8_);
          pcVar28 = (char *)(local_98 * local_1b8 * local_d8._16_8_ + local_d8._0_8_);
          iVar38 = 0;
          if ((int)_w < 2) {
            iVar31 = 0;
            iVar35 = 0;
            iVar29 = 0;
            uVar23 = 0;
          }
          else {
            iVar29 = 0;
            iVar37 = 1;
            iVar35 = 0;
            iVar31 = 0;
            iVar38 = 0;
            do {
              iVar30 = (int)*pcVar27;
              iVar39 = (int)pcVar27[1];
              iVar38 = pcVar28[1] * iVar39 + *pcVar28 * iVar30 + iVar38;
              iVar31 = pcVar28[3] * iVar39 + pcVar28[2] * iVar30 + iVar31;
              iVar35 = pcVar28[5] * iVar39 + pcVar28[4] * iVar30 + iVar35;
              iVar29 = pcVar28[7] * iVar39 + pcVar28[6] * iVar30 + iVar29;
              pcVar28 = pcVar28 + 8;
              pcVar27 = pcVar27 + 2;
              iVar37 = iVar37 + 2;
              uVar23 = _w & 0xfffffffe;
            } while (iVar37 < (int)_w);
          }
          if ((int)uVar23 < (int)_w) {
            lVar49 = 0;
            do {
              iVar37 = (int)pcVar27[lVar49];
              iVar38 = iVar38 + pcVar28[lVar49 * 4] * iVar37;
              iVar31 = iVar31 + pcVar28[lVar49 * 4 + 1] * iVar37;
              iVar35 = iVar35 + pcVar28[lVar49 * 4 + 2] * iVar37;
              iVar29 = iVar29 + pcVar28[lVar49 * 4 + 3] * iVar37;
              lVar49 = lVar49 + 1;
            } while (_w - uVar23 != (int)lVar49);
          }
          local_180 = puVar36;
          local_88 = puVar33;
          local_80 = puVar44;
          fVar53 = roundf(((float)iVar38 * (float)local_198 + fVar116) * fVar55);
          puVar36 = local_180;
          iVar38 = (int)fVar53;
          if (iVar38 < -0x7e) {
            iVar38 = -0x7f;
          }
          uVar20 = (undefined1)iVar38;
          if (0x7e < iVar38) {
            uVar20 = 0x7f;
          }
          *local_180 = uVar20;
          fVar53 = roundf(((float)iVar31 * fVar59 + fVar115) * (float)local_1a8);
          iVar38 = (int)fVar53;
          if (iVar38 < -0x7e) {
            iVar38 = -0x7f;
          }
          if (0x7e < iVar38) {
            iVar38 = 0x7f;
          }
          *puVar52 = (char)iVar38;
          fVar53 = roundf(((float)iVar35 * fVar58 + fVar60) * (float)local_1b0);
          iVar38 = (int)fVar53;
          if (iVar38 < -0x7e) {
            iVar38 = -0x7f;
          }
          if (0x7e < iVar38) {
            iVar38 = 0x7f;
          }
          *puVar45 = (char)iVar38;
          fVar53 = roundf(((float)iVar29 * fVar2 + fVar54) * fVar19);
          iVar38 = (int)fVar53;
          if (iVar38 < -0x7e) {
            iVar38 = -0x7f;
          }
          if (0x7e < iVar38) {
            iVar38 = 0x7f;
          }
          *local_80 = (char)iVar38;
          puVar36 = puVar36 + 1;
          puVar52 = puVar52 + 1;
          puVar45 = puVar45 + 1;
          puVar44 = local_80 + 1;
          uVar23 = (int)local_88 + 1;
          puVar33 = (undefined1 *)(ulong)uVar23;
        } while (uVar23 != _h);
      }
      uVar32 = local_1b8 + 1;
    } while (uVar32 != local_168);
  }
  if ((int)local_178 != (int)local_1c0) {
    lVar49 = (long)(int)local_178;
    pvVar46 = local_188;
    do {
      if (pvVar46 == (void *)0x0) {
        fVar116 = 0.0;
      }
      else {
        fVar116 = *(float *)((long)pvVar46 + lVar49 * 4);
      }
      puVar47 = (undefined4 *)
                (local_170->cstep * lVar49 * local_170->elemsize + (long)local_170->data);
      uVar32 = 0;
      pfVar5 = (scale_requant->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start;
      fVar115 = pfVar5[lVar49 * 2];
      fVar60 = pfVar5[lVar49 * 2 + 1];
      uVar23 = (uint)lVar49;
      if (3 < (int)_h) {
        uVar21 = uVar23 + 3;
        if (-1 < (int)uVar23) {
          uVar21 = uVar23;
        }
        local_198 = (void *)CONCAT44(fVar115,fVar115);
        local_1a8 = CONCAT44(fVar60,fVar60);
        uVar51 = 0;
        fStack_1a0 = fVar60;
        fStack_19c = fVar60;
        fStack_190 = fVar115;
        fStack_18c = fVar115;
        do {
          puVar22 = (ulong *)((uVar51 >> 2) * local_118 * local_158._16_8_ + local_158._0_8_);
          pcVar27 = (char *)(local_98 *
                             (long)(int)(((int)uVar21 >> 2) + (uVar23 - (uVar21 & 0xfffffffc))) *
                             local_d8._16_8_ + local_d8._0_8_);
          local_1d8 = (undefined1  [16])0x0;
          uVar40 = 0;
          if (1 < (int)_w) {
            iVar38 = 1;
            local_1d8._0_4_ = 0;
            local_1d8._4_4_ = 0;
            local_1d8._8_4_ = 0;
            local_1d8._12_4_ = 0;
            do {
              iVar35 = (int)pcVar27[1];
              iVar29 = (int)*pcVar27;
              auVar111._4_4_ = iVar29;
              auVar111._0_4_ = iVar29;
              auVar111._8_4_ = iVar29;
              auVar111._12_4_ = iVar29;
              auVar62._4_4_ = iVar35;
              auVar62._0_4_ = iVar35;
              auVar62._8_4_ = iVar35;
              auVar62._12_4_ = iVar35;
              auVar63._8_8_ = 0;
              auVar63._0_8_ = *puVar22;
              auVar83 = psllw(auVar63,8);
              auVar83 = psraw(auVar83,8);
              auVar10._10_2_ = 0;
              auVar10._0_10_ = auVar83._0_10_;
              auVar10._12_2_ = auVar83._6_2_;
              auVar13._8_2_ = auVar83._4_2_;
              auVar13._0_8_ = auVar83._0_8_;
              auVar13._10_4_ = auVar10._10_4_;
              auVar17._6_8_ = 0;
              auVar17._0_6_ = auVar13._8_6_;
              auVar79._6_8_ = SUB148(auVar17 << 0x40,6);
              auVar79._4_2_ = auVar83._2_2_;
              auVar79._0_2_ = auVar83._0_2_;
              auVar79._2_2_ = 0;
              auVar79._14_2_ = 0;
              auVar102 = pmaddwd(auVar79,auVar111);
              auVar83 = psraw(auVar63,8);
              auVar7._10_2_ = 0;
              auVar7._0_10_ = auVar83._0_10_;
              auVar7._12_2_ = auVar83._6_2_;
              auVar11._8_2_ = auVar83._4_2_;
              auVar11._0_8_ = auVar83._0_8_;
              auVar11._10_4_ = auVar7._10_4_;
              auVar18._6_8_ = 0;
              auVar18._0_6_ = auVar11._8_6_;
              auVar64._6_8_ = SUB148(auVar18 << 0x40,6);
              auVar64._4_2_ = auVar83._2_2_;
              auVar64._0_2_ = auVar83._0_2_;
              auVar64._2_2_ = 0;
              auVar64._14_2_ = 0;
              auVar83 = pmaddwd(auVar64,auVar62);
              local_1d8._0_4_ = local_1d8._0_4_ + auVar83._0_4_ + auVar102._0_4_;
              local_1d8._4_4_ = local_1d8._4_4_ + auVar83._4_4_ + auVar102._4_4_;
              local_1d8._8_4_ = local_1d8._8_4_ + auVar83._8_4_ + auVar102._8_4_;
              local_1d8._12_4_ = local_1d8._12_4_ + auVar83._12_4_ + auVar102._12_4_;
              pcVar27 = pcVar27 + 2;
              puVar22 = puVar22 + 1;
              iVar38 = iVar38 + 2;
            } while (iVar38 < (int)_w);
            uVar40 = _w & 0xfffffffe;
          }
          if ((int)uVar40 < (int)_w) {
            do {
              lVar48 = 0;
              do {
                *(int *)(local_1d8 + lVar48 * 4) =
                     *(int *)(local_1d8 + lVar48 * 4) +
                     (int)*(char *)((long)puVar22 + lVar48) * (int)*pcVar27;
                lVar48 = lVar48 + 1;
              } while (lVar48 != 4);
              pcVar27 = pcVar27 + 1;
              puVar22 = (ulong *)((long)puVar22 + 4);
              uVar40 = uVar40 + 1;
            } while (uVar40 != _w);
          }
          fVar54 = ((float)(int)local_1d8._0_4_ * (float)local_198 + fVar116) * (float)local_1a8;
          fVar58 = ((float)(int)local_1d8._4_4_ * local_198._4_4_ + fVar116) * local_1a8._4_4_;
          fVar59 = ((float)(int)local_1d8._8_4_ * fStack_190 + fVar116) * fStack_1a0;
          fVar55 = roundf(((float)(int)local_1d8._12_4_ * fStack_18c + fVar116) * fStack_19c);
          fVar59 = roundf(fVar59);
          fVar54 = roundf(fVar54);
          fVar58 = roundf(fVar58);
          auVar56._0_4_ = (int)fVar54;
          auVar56._4_4_ = (int)fVar58;
          auVar56._8_4_ = (int)fVar59;
          auVar56._12_4_ = (int)fVar55;
          auVar61._0_4_ = -(uint)((int)DAT_0031b380 < auVar56._0_4_);
          auVar61._4_4_ = -(uint)(DAT_0031b380._4_4_ < auVar56._4_4_);
          auVar61._8_4_ = -(uint)(DAT_0031b380._8_4_ < auVar56._8_4_);
          auVar61._12_4_ = -(uint)(DAT_0031b380._12_4_ < auVar56._12_4_);
          auVar83 = ~auVar61 & _DAT_0031b380 | auVar56 & auVar61;
          auVar57._0_4_ = -(uint)(auVar83._0_4_ < (int)DAT_0031b390);
          auVar57._4_4_ = -(uint)(auVar83._4_4_ < DAT_0031b390._4_4_);
          auVar57._8_4_ = -(uint)(auVar83._8_4_ < DAT_0031b390._8_4_);
          auVar57._12_4_ = -(uint)(auVar83._12_4_ < DAT_0031b390._12_4_);
          auVar83 = ~auVar57 & _DAT_0031b390 | auVar83 & auVar57;
          auVar83 = packssdw(auVar83,auVar83);
          auVar83 = packsswb(auVar83,auVar83);
          *puVar47 = auVar83._0_4_;
          puVar47 = puVar47 + 1;
          uVar32 = uVar51 + 4;
          puVar33 = (undefined1 *)(uVar51 + 7);
          pvVar46 = local_188;
          uVar51 = uVar32;
        } while (puVar33 < local_160);
      }
      if ((int)uVar32 < (int)_h) {
        uVar21 = uVar23 + 3;
        if (-1 < (int)uVar23) {
          uVar21 = uVar23;
        }
        do {
          if ((int)_w < 1) {
            fVar54 = 0.0;
          }
          else {
            lVar48 = 0;
            iVar38 = 0;
            do {
              iVar38 = iVar38 + (int)*(char *)(local_158._0_8_ +
                                              lVar48 + local_118 * local_158._16_8_ *
                                                       (ulong)(((uint)uVar32 & 3) +
                                                              ((uint)(uVar32 >> 2) & 0x3fffffff))) *
                                (int)*(char *)(local_d8._0_8_ +
                                              lVar48 + local_98 *
                                                       (long)(int)(((int)uVar21 >> 2) +
                                                                  (uVar23 - (uVar21 & 0xfffffffc)))
                                                       * local_d8._16_8_);
              lVar48 = lVar48 + 1;
            } while (_w != (uint)lVar48);
            fVar54 = (float)iVar38;
          }
          fVar54 = roundf((fVar54 * fVar115 + fVar116) * fVar60);
          iVar38 = (int)fVar54;
          if (iVar38 < -0x7e) {
            iVar38 = -0x7f;
          }
          uVar20 = (undefined1)iVar38;
          if (0x7e < iVar38) {
            uVar20 = 0x7f;
          }
          *(undefined1 *)puVar47 = uVar20;
          puVar47 = (undefined4 *)((long)puVar47 + 1);
          uVar40 = (uint)uVar32 + 1;
          uVar32 = (ulong)uVar40;
        } while (uVar40 != _h);
      }
      lVar49 = lVar49 + 1;
    } while (lVar49 < (long)local_1c0);
  }
  piVar14 = (int *)CONCAT44(local_d8._12_4_,local_d8._8_4_);
  if (piVar14 != (int *)0x0) {
    LOCK();
    *piVar14 = *piVar14 + -1;
    UNLOCK();
    if (*piVar14 == 0) {
      if ((Allocator *)local_d8._32_8_ == (Allocator *)0x0) {
        if ((void *)local_d8._0_8_ != (void *)0x0) {
          free((void *)local_d8._0_8_);
        }
      }
      else {
        (*(*(_func_int ***)local_d8._32_8_)[3])();
      }
    }
  }
  piVar14 = (int *)CONCAT44(local_158._12_4_,local_158._8_4_);
  if (piVar14 != (int *)0x0) {
    LOCK();
    *piVar14 = *piVar14 + -1;
    UNLOCK();
    if (*piVar14 == 0) {
      if ((Allocator *)local_158._32_8_ == (Allocator *)0x0) {
        if ((void *)local_158._0_8_ != (void *)0x0) {
          free((void *)local_158._0_8_);
        }
      }
      else {
        (*(*(_func_int ***)local_158._32_8_)[3])();
      }
    }
  }
  piVar14 = (int *)CONCAT44(local_78._12_4_,local_78._8_4_);
  if (piVar14 != (int *)0x0) {
    LOCK();
    *piVar14 = *piVar14 + -1;
    UNLOCK();
    if (*piVar14 == 0) {
      if ((Allocator *)local_78._32_8_ == (Allocator *)0x0) {
        if ((void *)local_78._0_8_ != (void *)0x0) {
          free((void *)local_78._0_8_);
        }
      }
      else {
        (*(*(_func_int ***)local_78._32_8_)[3])();
      }
    }
  }
  return;
}

Assistant:

static void conv_im2col_sgemm_int8_requant_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& _kernel,
        const int kernel_w, const int kernel_h, const int stride_w, const int stride_h, const Mat& _bias, std::vector<float> scale_requant, const Option& opt)
{
    int w = bottom_blob.w;
    int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    const signed char* kernel = _kernel;
    const float* bias = _bias;

    // im2row
    Mat bottom_im2row(kernel_h * kernel_w * inch, outw * outh, 1UL, opt.workspace_allocator);
    {
        signed char* ret = (signed char*)bottom_im2row;
        int retID = 0;

        for (int i = 0; i < outh; i++)
        {
            for (int j = 0; j < outw; j++)
            {
                for (int p = 0; p < inch; p++)
                {
                    const signed char* input = bottom_blob.channel(p);
                    for (int u = 0; u < kernel_h; u++)
                    {
                        for (int v = 0; v < kernel_w; v++)
                        {
                            int row = u + i * stride_h;
                            int col = v + j * stride_w;
                            int index = row * w + col;
                            ret[retID] = input[index];
                            retID++;
                        }
                    }
                }
            }
        }
    }

    int kernel_size = kernel_w * kernel_h;
    int out_size = outw * outh;

    // int M = outch;  // outch
    int N = outw * outh;                // outsize or out stride
    int K = kernel_w * kernel_h * inch; // ksize * inch

    // bottom_im2row memory packed 4 x 4
    Mat bottom_tm(4 * kernel_size, inch, out_size / 4 + out_size % 4, (size_t)1u, opt.workspace_allocator);
    {
        int nn_size = out_size >> 2;
        int remain_size_start = nn_size << 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = ii * 4;

            const signed char* img0 = bottom_im2row.row<signed char>(i);
            const signed char* img1 = bottom_im2row.row<signed char>(i + 1);
            const signed char* img2 = bottom_im2row.row<signed char>(i + 2);
            const signed char* img3 = bottom_im2row.row<signed char>(i + 3);

            signed char* tmpptr = bottom_tm.channel(i / 4);

            int q = 0;
            for (; q + 1 < inch * kernel_size; q = q + 2)
            {
                tmpptr[0] = img0[0];
                tmpptr[1] = img0[1];
                tmpptr[2] = img1[0];
                tmpptr[3] = img1[1];
                tmpptr[4] = img2[0];
                tmpptr[5] = img2[1];
                tmpptr[6] = img3[0];
                tmpptr[7] = img3[1];

                tmpptr += 8;
                img0 += 2;
                img1 += 2;
                img2 += 2;
                img3 += 2;
            }

            for (; q < inch * kernel_size; q++)
            {
                tmpptr[0] = img0[0];
                tmpptr[1] = img1[0];
                tmpptr[2] = img2[0];
                tmpptr[3] = img3[0];

                tmpptr += 4;
                img0 += 1;
                img1 += 1;
                img2 += 1;
                img3 += 1;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = remain_size_start; i < out_size; i++)
        {
            const signed char* img0 = bottom_im2row.row<signed char>(i);

            signed char* tmpptr = bottom_tm.channel(i / 4 + i % 4);

            int q = 0;
            for (; q + 1 < inch * kernel_size; q = q + 2)
            {
                tmpptr[0] = img0[0];
                tmpptr[1] = img0[1];

                tmpptr += 2;
                img0 += 2;
            }

            for (; q < inch * kernel_size; q++)
            {
                tmpptr[0] = img0[0];

                tmpptr += 1;
                img0 += 1;
            }
        }
    }

    // kernel memory packed 4 x 4
    Mat kernel_tm(4 * kernel_size, inch, outch / 4 + outch % 4, (size_t)1u, opt.workspace_allocator);
    {
        int nn_outch = 0;
        int remain_outch_start = 0;

        nn_outch = outch >> 2;
        remain_outch_start = nn_outch << 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int pp = 0; pp < nn_outch; pp++)
        {
            int p = pp * 4;

            const signed char* k0 = kernel + (p + 0) * inch * kernel_size;
            const signed char* k1 = kernel + (p + 1) * inch * kernel_size;
            const signed char* k2 = kernel + (p + 2) * inch * kernel_size;
            const signed char* k3 = kernel + (p + 3) * inch * kernel_size;

            signed char* ktmp = kernel_tm.channel(p / 4);

            int q = 0;
            for (; q + 1 < inch * kernel_size; q += 2)
            {
                ktmp[0] = k0[0];
                ktmp[1] = k0[1];
                ktmp[2] = k1[0];
                ktmp[3] = k1[1];
                ktmp[4] = k2[0];
                ktmp[5] = k2[1];
                ktmp[6] = k3[0];
                ktmp[7] = k3[1];

                ktmp += 8;

                k0 += 2;
                k1 += 2;
                k2 += 2;
                k3 += 2;
            }

            for (; q < inch * kernel_size; q++)
            {
                ktmp[0] = k0[0];
                ktmp[1] = k1[0];
                ktmp[2] = k2[0];
                ktmp[3] = k3[0];
                ktmp += 4;

                k0 += 1;
                k1 += 1;
                k2 += 1;
                k3 += 1;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p = remain_outch_start; p < outch; p++)
        {
            const signed char* k0 = kernel + (p + 0) * inch * kernel_size;

            signed char* ktmp = kernel_tm.channel(p / 4 + p % 4);

            int q = 0;
            for (; q + 1 < inch * kernel_size; q = q + 2)
            {
                ktmp[0] = k0[0];
                ktmp[1] = k0[1];
                ktmp += 2;
                k0 += 2;
            }

            for (; q < inch * kernel_size; q++)
            {
                ktmp[0] = k0[0];
                ktmp++;
                k0++;
            }
        }
    }

    // 4x4
    // sgemm(int M, int N, int K, float* A, float* B, float* C)
    {
        // int M = outch;  // outch
        // int N = outw * outh; // outsize or out stride
        // int L = kernel_w * kernel_h * inch; // ksize * inch

        int nn_outch = 0;
        int remain_outch_start = 0;

        nn_outch = outch >> 2;
        remain_outch_start = nn_outch << 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int pp = 0; pp < nn_outch; pp++)
        {
            int i = pp * 4;

            signed char* output0 = top_blob.channel(i);
            signed char* output1 = top_blob.channel(i + 1);
            signed char* output2 = top_blob.channel(i + 2);
            signed char* output3 = top_blob.channel(i + 3);

            const float bias0 = bias ? bias[i] : 0.f;
            const float bias1 = bias ? bias[i + 1] : 0.f;
            const float bias2 = bias ? bias[i + 2] : 0.f;
            const float bias3 = bias ? bias[i + 3] : 0.f;

            const float scale_requant_in0 = scale_requant[2 * i];
            const float scale_requant_out0 = scale_requant[2 * i + 1];
            const float scale_requant_in1 = scale_requant[2 * (i + 1)];
            const float scale_requant_out1 = scale_requant[2 * (i + 1) + 1];
            const float scale_requant_in2 = scale_requant[2 * (i + 2)];
            const float scale_requant_out2 = scale_requant[2 * (i + 2) + 1];
            const float scale_requant_in3 = scale_requant[2 * (i + 3)];
            const float scale_requant_out3 = scale_requant[2 * (i + 3) + 1];

            int j = 0;
            for (; j + 3 < N; j = j + 4)
            {
                signed char* vb = bottom_tm.channel(j / 4);
                signed char* va = kernel_tm.channel(i / 4);

                int sum0[4] = {0};
                int sum1[4] = {0};
                int sum2[4] = {0};
                int sum3[4] = {0};

                int k = 0;

                for (; k + 1 < K; k = k + 2)
                {
                    for (int n = 0; n < 4; n++)
                    {
                        sum0[n] += (int)va[0] * vb[2 * n]; // k0
                        sum0[n] += (int)va[1] * vb[2 * n + 1];

                        sum1[n] += (int)va[2] * vb[2 * n]; // k1
                        sum1[n] += (int)va[3] * vb[2 * n + 1];

                        sum2[n] += (int)va[4] * vb[2 * n]; // k2
                        sum2[n] += (int)va[5] * vb[2 * n + 1];

                        sum3[n] += (int)va[6] * vb[2 * n]; // k3
                        sum3[n] += (int)va[7] * vb[2 * n + 1];
                    }

                    va += 8;
                    vb += 8;
                }

                for (; k < K; k++)
                {
                    for (int n = 0; n < 4; n++)
                    {
                        sum0[n] += (int)va[0] * vb[n];
                        sum1[n] += (int)va[1] * vb[n];
                        sum2[n] += (int)va[2] * vb[n];
                        sum3[n] += (int)va[3] * vb[n];
                    }

                    va += 4;
                    vb += 4;
                }

                for (int n = 0; n < 4; n++)
                {
                    output0[n] = float2int8(((float)sum0[n] * scale_requant_in0 + bias0) * scale_requant_out0);
                    output1[n] = float2int8(((float)sum1[n] * scale_requant_in1 + bias1) * scale_requant_out1);
                    output2[n] = float2int8(((float)sum2[n] * scale_requant_in2 + bias2) * scale_requant_out2);
                    output3[n] = float2int8(((float)sum3[n] * scale_requant_in3 + bias3) * scale_requant_out3);
                }
                output0 += 4;
                output1 += 4;
                output2 += 4;
                output3 += 4;
            }

            for (; j < N; j++)
            {
                int sum0 = 0;
                int sum1 = 0;
                int sum2 = 0;
                int sum3 = 0;

                signed char* vb = bottom_tm.channel(j / 4 + j % 4);
                signed char* va = kernel_tm.channel(i / 4);

                int k = 0;

                for (; k + 1 < K; k = k + 2)
                {
                    sum0 += (int)va[0] * vb[0];
                    sum0 += (int)va[1] * vb[1];

                    sum1 += (int)va[2] * vb[0];
                    sum1 += (int)va[3] * vb[1];

                    sum2 += (int)va[4] * vb[0];
                    sum2 += (int)va[5] * vb[1];

                    sum3 += (int)va[6] * vb[0];
                    sum3 += (int)va[7] * vb[1];

                    va += 8;
                    vb += 2;
                }

                for (; k < K; k++)
                {
                    sum0 += (int)va[0] * vb[0];
                    sum1 += (int)va[1] * vb[0];
                    sum2 += (int)va[2] * vb[0];
                    sum3 += (int)va[3] * vb[0];

                    va += 4;
                    vb += 1;
                }

                output0[0] = float2int8(((float)sum0 * scale_requant_in0 + bias0) * scale_requant_out0);
                output1[0] = float2int8(((float)sum1 * scale_requant_in1 + bias1) * scale_requant_out1);
                output2[0] = float2int8(((float)sum2 * scale_requant_in2 + bias2) * scale_requant_out2);
                output3[0] = float2int8(((float)sum3 * scale_requant_in3 + bias3) * scale_requant_out3);

                output0++;
                output1++;
                output2++;
                output3++;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = remain_outch_start; i < outch; i++)
        {
            signed char* output = top_blob.channel(i);

            const float bias0 = bias ? bias[i] : 0.f;

            const float scale_requant_in0 = scale_requant[2 * i];
            const float scale_requant_out0 = scale_requant[2 * i + 1];

            int j = 0;
            for (; j + 3 < N; j = j + 4)
            {
                signed char* vb = bottom_tm.channel(j / 4);
                signed char* va = kernel_tm.channel(i / 4 + i % 4);
                int sum[4] = {0};

                int k = 0;
                for (; k + 1 < K; k = k + 2)
                {
                    for (int n = 0; n < 4; n++)
                    {
                        sum[n] += (int)va[0] * vb[2 * n];
                        sum[n] += (int)va[1] * vb[2 * n + 1];
                    }
                    va += 2;
                    vb += 8;
                }

                for (; k < K; k++)
                {
                    for (int n = 0; n < 4; n++)
                    {
                        sum[n] += (int)va[0] * vb[n];
                    }
                    va += 1;
                    vb += 4;
                }

                for (int n = 0; n < 4; n++)
                {
                    output[n] = float2int8(((float)sum[n] * scale_requant_in0 + bias0) * scale_requant_out0);
                }
                output += 4;
            }

            for (; j < N; j++)
            {
                int sum = 0;

                signed char* vb = bottom_tm.channel(j / 4 + j % 4);
                signed char* va = kernel_tm.channel(i / 4 + i % 4);

                for (int k = 0; k < K; k++)
                {
                    sum += (int)va[0] * vb[0];

                    va += 1;
                    vb += 1;
                }
                output[0] = float2int8(((float)sum * scale_requant_in0 + bias0) * scale_requant_out0);

                output++;
            }
        }
    }

    // // sgemm(int M, int N, int K, float* A, float* B, float* C)
    // {
    //     for (int i=0; i<M; i++)
    //     {
    //         int* output = top_blob.channel(i);

    //         for (int j=0; j<N; j++)
    //         {
    //             int sum = 0;

    //             signed char* vb = (signed char*)bottom_im2row + K * j;
    //             const signed char* va = kernel + K * i;

    //             for (int k=0; k<K; k++)
    //             {
    //                 sum += (int)va[0] * vb[0];

    //                 va += 1;
    //                 vb += 1;
    //             }
    //             output[0] = sum;

    //             output++;
    //         }
    //     }
    // }
}